

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow *window,int n)

{
  ImGuiID IVar1;
  long in_RDI;
  ImGuiID id;
  undefined1 local_c [12];
  
  IVar1 = ImHashStr("#RESIZE",0,*(ImGuiID *)(in_RDI + 0x10));
  IVar1 = ImHashData(local_c,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeCornerID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n < 4);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}